

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

ostream * operator<<(ostream *os,ipv4_address *addr)

{
  char *pcVar1;
  
  pcVar1 = inet_ntoa((in_addr)addr->addr_net);
  std::operator<<(os,pcVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, ipv4_address const& addr)
{
    in_addr tmp{};
    tmp.s_addr = addr.addr_net;
    os << inet_ntoa(tmp);
    return os;
}